

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive.cpp
# Opt level: O2

bool __thiscall pbrt::TransformedPrimitive::IntersectP(TransformedPrimitive *this,Ray *r,Float tMax)

{
  bool bVar1;
  Ray ray;
  Float local_44;
  Ray local_40;
  
  local_44 = tMax;
  Transform::ApplyInverse(&local_40,*(Transform **)(this + 8),r,&local_44);
  bVar1 = PrimitiveHandle::IntersectP((PrimitiveHandle *)this,&local_40,local_44);
  return bVar1;
}

Assistant:

bool TransformedPrimitive::IntersectP(const Ray &r, Float tMax) const {
    Ray ray = renderFromPrimitive->ApplyInverse(r, &tMax);
    return primitive.IntersectP(ray, tMax);
}